

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::insertChunks
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *png,
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *chunks)

{
  pointer puVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer pvVar2;
  bool bVar3;
  uchar *puVar4;
  long lVar5;
  size_t i;
  pointer puVar6;
  uchar *chunk;
  ulong uVar7;
  allocator<char> local_91;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  char type [5];
  
  puVar1 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 8;
  local_88 = (uchar *)0x0;
  local_80 = (uchar *)0x0;
  local_90 = (uchar *)0x0;
  chunk = puVar6;
  do {
    if ((puVar1 <= chunk + 8) || (chunk < puVar6)) {
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __first._M_current =
           (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,(const_iterator)0x0,
                 __first,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(__first._M_current + local_90));
      lVar5 = 8;
      for (uVar7 = 0;
          pvVar2 = (chunks->
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)(chunks->
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18)
          ; uVar7 = uVar7 + 1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                   (const_iterator)
                   result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)pvVar2 + lVar5 + -8),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)
                      ((long)&(pvVar2->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data + lVar5));
        lVar5 = lVar5 + 0x18;
      }
      puVar1 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                 (const_iterator)
                 result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_90 + (long)puVar1),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_80 + (long)puVar1));
      lVar5 = 8;
      for (uVar7 = 0;
          pvVar2 = chunks[1].
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)chunks[1].
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
          uVar7 = uVar7 + 1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                   (const_iterator)
                   result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)pvVar2 + lVar5 + -8),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)
                      ((long)&(pvVar2->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data + lVar5));
        lVar5 = lVar5 + 0x18;
      }
      puVar1 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                 (const_iterator)
                 result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_80 + (long)puVar1),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_88 + (long)puVar1));
      lVar5 = 8;
      for (uVar7 = 0;
          pvVar2 = chunks[2].
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)(((long)chunks[2].
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
          uVar7 = uVar7 + 1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                   (const_iterator)
                   result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)pvVar2 + lVar5 + -8),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)
                      ((long)&(pvVar2->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data + lVar5));
        lVar5 = lVar5 + 0x18;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
                 (const_iterator)
                 result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(local_88 +
                   (long)(png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(png,&result);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return 0;
    }
    lodepng_chunk_type(type,chunk);
    std::__cxx11::string::string<std::allocator<char>>((string *)&result,type,&local_91);
    if ((result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish == (pointer)0x4) &&
       (puVar4 = lodepng_chunk_next_const(chunk), chunk < puVar4)) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &result,"PLTE");
      if (bVar3) {
        if (local_90 == (uchar *)0x0) {
          local_90 = chunk + (8 - (long)puVar6);
        }
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&result,"IDAT");
        if (bVar3) {
          if (local_90 == (uchar *)0x0) {
            local_90 = chunk + (8 - (long)puVar6);
          }
          if (local_80 == (uchar *)0x0) {
            local_80 = chunk + (8 - (long)puVar6);
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&result,"IEND");
          if ((bVar3) && (local_88 == (uchar *)0x0)) {
            local_88 = chunk + (8 - (long)puVar6);
          }
        }
      }
      bVar3 = true;
      chunk = puVar4;
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&result);
  } while (bVar3);
  return 1;
}

Assistant:

unsigned insertChunks(std::vector<unsigned char>& png,
                      const std::vector<std::vector<unsigned char> > chunks[3]) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  long l0 = 0; //location 0: IHDR-l0-PLTE (or IHDR-l0-l1-IDAT)
  long l1 = 0; //location 1: PLTE-l1-IDAT (or IHDR-l0-l1-IDAT)
  long l2 = 0; //location 2: IDAT-l2-IEND

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "PLTE") {
      if(l0 == 0) l0 = chunk - begin + 8;
    } else if(name == "IDAT") {
      if(l0 == 0) l0 = chunk - begin + 8;
      if(l1 == 0) l1 = chunk - begin + 8;
    } else if(name == "IEND") {
      if(l2 == 0) l2 = chunk - begin + 8;
    }

    chunk = next;
  }

  std::vector<unsigned char> result;
  result.insert(result.end(), png.begin(), png.begin() + l0);
  for(size_t i = 0; i < chunks[0].size(); i++) result.insert(result.end(), chunks[0][i].begin(), chunks[0][i].end());
  result.insert(result.end(), png.begin() + l0, png.begin() + l1);
  for(size_t i = 0; i < chunks[1].size(); i++) result.insert(result.end(), chunks[1][i].begin(), chunks[1][i].end());
  result.insert(result.end(), png.begin() + l1, png.begin() + l2);
  for(size_t i = 0; i < chunks[2].size(); i++) result.insert(result.end(), chunks[2][i].begin(), chunks[2][i].end());
  result.insert(result.end(), png.begin() + l2, png.end());

  png = result;
  return 0;
}